

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Check.cpp
# Opt level: O1

TestResult *
rc::detail::checkProperty
          (TestResult *__return_storage_ptr__,Property *property,TestMetadata *metadata,
          TestParams *params,TestListener *listener,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
          *reproduceMap)

{
  undefined1 *puVar1;
  const_iterator cVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  Reproduce reproduce;
  undefined1 local_98 [16];
  _Rb_tree_node_base local_88;
  unsigned_long local_68;
  int local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  bVar6 = 0;
  if ((reproduceMap->_M_h)._M_element_count == 0) {
    testProperty(__return_storage_ptr__,property,metadata,params,listener);
  }
  else {
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&reproduceMap->_M_h,&metadata->id);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
        ._M_cur == (__node_type *)0x0 || (metadata->id)._M_string_length == 0) {
      local_88._M_left = &local_88;
      local_88._M_color = _S_red;
      local_68 = 0;
      local_98._0_4_ = 0;
      __return_storage_ptr__->m_typeIndex = 0;
      *(undefined4 *)&__return_storage_ptr__->m_storage = 0;
      puVar1 = (undefined1 *)((long)&__return_storage_ptr__->m_storage + 0x10);
      *(undefined4 *)((long)&__return_storage_ptr__->m_storage + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->m_storage + 0x18) = 0;
      *(undefined1 **)((long)&__return_storage_ptr__->m_storage + 0x20) = puVar1;
      *(undefined1 **)((long)&__return_storage_ptr__->m_storage + 0x28) = puVar1;
      local_88._M_parent = (_Base_ptr)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->m_storage + 0x30) = 0;
      local_88._M_right = local_88._M_left;
      std::
      _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
                   *)(local_98 + 8));
    }
    else {
      puVar4 = (undefined8 *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
                      ._M_cur + 0x28);
      puVar5 = (undefined8 *)local_98;
      for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      local_40 = *(int *)((long)cVar2.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
                                ._M_cur + 0x80);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_38,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)cVar2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
                        ._M_cur + 0x88));
      if ((params->disableShrinking == true) &&
         (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start)) {
        local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      reproduceProperty(__return_storage_ptr__,property,(Reproduce *)local_98);
      if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TestResult
checkProperty(const Property &property,
              const TestMetadata &metadata,
              const TestParams &params,
              TestListener &listener,
              const std::unordered_map<std::string, Reproduce> &reproduceMap) {
  if (reproduceMap.empty()) {
    return testProperty(property, metadata, params, listener);
  }

  const auto it = reproduceMap.find(metadata.id);
  if (metadata.id.empty() || (it == end(reproduceMap))) {
    SuccessResult success;
    success.numSuccess = 0;
    return success;
  } else {
    auto reproduce = it->second;
    if (params.disableShrinking) {
      reproduce.shrinkPath.clear();
    }
    return reproduceProperty(property, reproduce);
  }
}